

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torus_refinement_demo.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  undefined8 this;
  uint uVar4;
  PointerType ptr;
  options_description_easy_init *poVar5;
  typed_value<unsigned_long,_char> *ptVar6;
  typed_value<unsigned_int,_char> *ptVar7;
  typed_value<std::vector<double,_std::allocator<double>_>,_char> *ptVar8;
  const_iterator cVar9;
  ostream *poVar10;
  variable_value *pvVar11;
  unsigned_long *puVar12;
  uint *puVar13;
  vector<double,_std::allocator<double>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  int iVar18;
  uint uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  ulong uVar22;
  initializer_list<double> __l;
  string __str;
  shared_ptr<lf::mesh::Mesh> mesh_ptr;
  vector<double,_std::allocator<double>_> top_right_corner_coords;
  VtkWriter vtk_writer;
  options_description desc;
  variables_map vm;
  MeshHierarchy multi_mesh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  __uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_4f8;
  __uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  unsigned_long local_4c8;
  string local_4c0;
  string local_4a0;
  shared_ptr<const_lf::mesh::Mesh> local_480;
  undefined1 local_470 [16];
  vector<double,_std::allocator<double>_> local_460;
  undefined1 local_448 [480];
  StructuredMeshBuilder local_268;
  options_description local_228;
  function1<std::pair<std::string,_std::string>,_const_std::string_&> local_1a8;
  variables_map local_188;
  MeshHierarchy local_e8;
  
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"Allowed options","");
  boost::program_options::options_description::options_description
            (&local_228,(string *)local_448,0x50,0x28);
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  local_268._vptr_StructuredMeshBuilder =
       (_func_int **)boost::program_options::options_description::add_options(&local_228);
  poVar5 = boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_268,"help","Produce this help message"
                     );
  ptVar6 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_518._M_dataplus._M_p = (pointer)0x4;
  ptVar6 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar6,(unsigned_long *)&local_518);
  poVar5 = boost::program_options::options_description_easy_init::operator()
                     (poVar5,"num_steps",(value_semantic *)ptVar6,
                      "Number of uniform refinement steps");
  ptVar7 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_538._M_dataplus._M_p._0_4_ = 4;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar7,(uint *)&local_538);
  poVar5 = boost::program_options::options_description_easy_init::operator()
                     (poVar5,"num_x_cells",(value_semantic *)ptVar7,"Number of cells in x direction"
                     );
  ptVar7 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_4e8._M_dataplus._M_p._0_4_ = 4;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar7,(uint *)&local_4e8);
  poVar5 = boost::program_options::options_description_easy_init::operator()
                     (poVar5,"num_y_cells",(value_semantic *)ptVar7,"Number of cells in y direction"
                     );
  ptVar8 = boost::program_options::value<std::vector<double,std::allocator<double>>>
                     ((vector<double,_std::allocator<double>_> *)0x0);
  ptVar8->m_multitoken = true;
  local_188.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)&DAT_3ff0000000000000;
  local_188.super_abstract_variables_map.m_next = (abstract_variables_map *)0x4010000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_188;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_e8,__l,(allocator_type *)&local_460);
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"1., 4.","");
  ptVar8 = boost::program_options::typed_value<std::vector<double,_std::allocator<double>_>,_char>::
           default_value(ptVar8,(vector<double,_std::allocator<double>_> *)&local_e8,
                         (string *)local_448);
  boost::program_options::options_description_easy_init::operator()
            (poVar5,"top_right_corner",(value_semantic *)ptVar8,
             "Coordinates of top right corner of rectangle with bottom left at (0,0)");
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  if (local_e8._vptr_MeshHierarchy != (_func_int **)0x0) {
    operator_delete(local_e8._vptr_MeshHierarchy,
                    (long)local_e8.meshes_.
                          super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e8._vptr_MeshHierarchy);
  }
  boost::program_options::variables_map::variables_map(&local_188);
  local_1a8.super_function_base.vtable = (vtable_base *)0x0;
  local_1a8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_1a8.super_function_base.functor._8_8_ = 0;
  local_1a8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_448,argc,argv,&local_228,0,&local_1a8);
  boost::program_options::store((parsed_options *)local_448,&local_188,false);
  pcVar2 = local_448 + 0x10;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_448);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_1a8);
  boost::program_options::notify(&local_188);
  local_448._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"help","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(&local_188.
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ._M_t,(key_type *)local_448);
  if ((pointer)local_448._0_8_ != pcVar2) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node ==
      &local_188.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    local_448._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"num_steps","");
    pvVar11 = boost::program_options::abstract_variables_map::operator[]
                        (&local_188.super_abstract_variables_map,(string *)local_448);
    puVar12 = boost::any_cast<unsigned_long_const&>(&pvVar11->v);
    local_4c8 = *puVar12;
    if ((pointer)local_448._0_8_ != pcVar2) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    local_448._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"num_x_cells","");
    pvVar11 = boost::program_options::abstract_variables_map::operator[]
                        (&local_188.super_abstract_variables_map,(string *)local_448);
    puVar13 = boost::any_cast<unsigned_int_const&>(&pvVar11->v);
    uVar19 = *puVar13;
    if ((pointer)local_448._0_8_ != pcVar2) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    local_448._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"num_y_cells","");
    pvVar11 = boost::program_options::abstract_variables_map::operator[]
                        (&local_188.super_abstract_variables_map,(string *)local_448);
    puVar13 = boost::any_cast<unsigned_int_const&>(&pvVar11->v);
    uVar3 = *puVar13;
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"top_right_corner","");
    pvVar11 = boost::program_options::abstract_variables_map::operator[]
                        (&local_188.super_abstract_variables_map,(string *)local_448);
    __x = boost::any_cast<std::vector<double,std::allocator<double>>const&>(&pvVar11->v);
    std::vector<double,_std::allocator<double>_>::vector(&local_460,__x);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    local_4f0._M_t.
    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
    super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
         (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
         operator_new(0x60);
    *(undefined ***)
     local_4f0._M_t.
     super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
     super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = &PTR_DimWorld_003410e8;
    *(undefined4 *)
     ((long)local_4f0._M_t.
            super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
            .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 8) = 3;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x10) = 0;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x18) = 0;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x20) = 0;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x28) = 0;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x30) = 0;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x38) = 0;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x40) = 0;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x48) = 0;
    *(long *)((long)local_4f0._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x50) = 0;
    *(undefined1 *)
     ((long)local_4f0._M_t.
            super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
            .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x58) = 1;
    lf::mesh::utils::TorusMeshBuilder::TorusMeshBuilder
              ((TorusMeshBuilder *)&local_268,
               (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
               &local_4f0);
    if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
        local_4f0._M_t.
        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl != (MeshFactory *)0x0) {
      (**(code **)(*(long *)local_4f0._M_t.
                            super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                            .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl +
                  0x38))();
    }
    local_4f0._M_t.
    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
    super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
         (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
         (_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)0x0
    ;
    local_448._0_8_ = (pointer)0x0;
    local_448._8_8_ = (pointer)0x0;
    lf::mesh::utils::StructuredMeshBuilder::setBottomLeftCorner<Eigen::Matrix<double,2,1,0,2,1>>
              (&local_268,(Matrix<double,_2,_1,_0,_2,_1> *)local_448);
    local_448._0_8_ =
         *local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    local_448._8_8_ =
         local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    lf::mesh::utils::StructuredMeshBuilder::setTopRightCorner<Eigen::Matrix<double,2,1,0,2,1>>
              (&local_268,(Matrix<double,_2,_1,_0,_2,_1> *)local_448);
    local_268.num_of_x_cells_ = uVar19;
    local_268.num_of_y_cells_ = uVar3;
    lf::mesh::utils::TorusMeshBuilder::Build((TorusMeshBuilder *)local_470);
    lf::mesh::utils::PrintInfo((ostream *)&std::cout,(Mesh *)local_470._0_8_,0xb);
    local_448[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_448,1);
    local_4f8._M_t.
    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
    super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
         (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
         operator_new(0x60);
    *(undefined ***)
     local_4f8._M_t.
     super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
     super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = &PTR_DimWorld_003410e8;
    *(undefined4 *)
     ((long)local_4f8._M_t.
            super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
            .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 8) = 3;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x10) = 0;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x18) = 0;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x20) = 0;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x28) = 0;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x30) = 0;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x38) = 0;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x40) = 0;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x48) = 0;
    *(long *)((long)local_4f8._M_t.
                    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                    .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x50) = 0;
    *(undefined1 *)
     ((long)local_4f8._M_t.
            super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
            .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x58) = 1;
    lf::refinement::MeshHierarchy::MeshHierarchy
              (&local_e8,(shared_ptr<lf::mesh::Mesh> *)local_470,
               (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
               &local_4f8);
    if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
        local_4f8._M_t.
        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl != (MeshFactory *)0x0) {
      (**(code **)(*(long *)local_4f8._M_t.
                            super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                            .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl +
                  0x38))();
    }
    local_4f8._M_t.
    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
    super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
         (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
         (_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)0x0
    ;
    if (local_4c8 != 0) {
      paVar1 = &local_518.field_2;
      uVar22 = 0;
      do {
        lf::refinement::MeshHierarchy::getMesh((MeshHierarchy *)local_448,(size_type)&local_e8);
        this = local_448._8_8_;
        uVar21 = local_448._0_8_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mesh on level ",0xe);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
        (*(*(_func_int ***)uVar21)[3])(uVar21,2);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," nodes, ",8);
        (*(*(_func_int ***)uVar21)[3])(uVar21,1);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," edges, ",8);
        (*(*(_func_int ***)uVar21)[3])(uVar21,0);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," cells,",7);
        local_448[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_448,1);
        local_518._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"torus_refinement","");
        uVar19 = 1;
        if (9 < uVar22) {
          uVar3 = 4;
          uVar15 = uVar22;
          do {
            uVar19 = uVar3;
            uVar4 = (uint)uVar15;
            if (uVar4 < 100) {
              uVar19 = uVar19 - 2;
              goto LAB_00119d26;
            }
            if (uVar4 < 1000) {
              uVar19 = uVar19 - 1;
              goto LAB_00119d26;
            }
            if (uVar4 < 10000) goto LAB_00119d26;
            uVar15 = (uVar15 & 0xffffffff) / 10000;
            uVar3 = uVar19 + 4;
          } while (99999 < uVar4);
          uVar19 = uVar19 + 1;
        }
LAB_00119d26:
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_538,(ulong)uVar19,'-');
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_538._M_dataplus._M_p,uVar19,(uint)uVar22);
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != paVar1) {
          uVar20 = local_518.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_538._M_string_length + local_518._M_string_length) {
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            uVar20 = local_538.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < local_538._M_string_length + local_518._M_string_length)
          goto LAB_00119d98;
          pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_538,0,0,local_518._M_dataplus._M_p,local_518._M_string_length);
        }
        else {
LAB_00119d98:
          pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_518,local_538._M_dataplus._M_p,local_538._M_string_length);
        }
        local_448._0_8_ = (pbVar14->_M_dataplus)._M_p;
        paVar17 = &pbVar14->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._0_8_ == paVar17) {
          local_448._16_8_ = paVar17->_M_allocated_capacity;
          local_448._24_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
          local_448._0_8_ = (Mesh *)(local_448 + 0x10);
        }
        else {
          local_448._16_8_ = paVar17->_M_allocated_capacity;
        }
        local_448._8_8_ = pbVar14->_M_string_length;
        (pbVar14->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar14->_M_string_length = 0;
        paVar17->_M_local_buf[0] = '\0';
        pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_448,".csv");
        local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar14->_M_dataplus)._M_p;
        paVar16 = &pbVar14->field_2;
        if (paVar17 == paVar16) {
          local_4c0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_4c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
        }
        else {
          local_4c0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_4c0._M_dataplus._M_p = (pointer)paVar17;
        }
        local_4c0._M_string_length = pbVar14->_M_string_length;
        (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar14->_M_string_length = 0;
        (pbVar14->field_2)._M_local_buf[0] = '\0';
        lf::io::writeMatplotlib((Mesh *)uVar21,&local_4c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((Mesh *)local_448._0_8_ != (Mesh *)(local_448 + 0x10)) {
          operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != paVar1) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        local_480.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar21;
        local_480.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        if ((pointer)this != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(this + 8) = (int)*(size_type *)(this + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(this + 8) = (int)*(size_type *)(this + 8) + 1;
          }
        }
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"torus_refinement","");
        uVar19 = 1;
        if (9 < uVar22) {
          uVar3 = 4;
          uVar15 = uVar22;
          do {
            uVar19 = uVar3;
            uVar4 = (uint)uVar15;
            if (uVar4 < 100) {
              uVar19 = uVar19 - 2;
              goto LAB_00119f7c;
            }
            if (uVar4 < 1000) {
              uVar19 = uVar19 - 1;
              goto LAB_00119f7c;
            }
            if (uVar4 < 10000) goto LAB_00119f7c;
            uVar15 = (uVar15 & 0xffffffff) / 10000;
            uVar3 = uVar19 + 4;
          } while (99999 < uVar4);
          uVar19 = uVar19 + 1;
        }
LAB_00119f7c:
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_4e8,(ulong)uVar19,'-');
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_4e8._M_dataplus._M_p,uVar19,(uint)uVar22);
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          uVar21 = local_538.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_4e8._M_string_length + local_538._M_string_length) {
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            uVar21 = local_4e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_4e8._M_string_length + local_538._M_string_length)
          goto LAB_00119fef;
          pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_4e8,0,0,local_538._M_dataplus._M_p,local_538._M_string_length);
        }
        else {
LAB_00119fef:
          pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_538,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
        }
        local_518._M_dataplus._M_p = (pbVar14->_M_dataplus)._M_p;
        paVar17 = &pbVar14->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p == paVar17) {
          local_518.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_518.field_2._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
          local_518._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_518.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_518._M_string_length = pbVar14->_M_string_length;
        (pbVar14->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar14->_M_string_length = 0;
        paVar17->_M_local_buf[0] = '\0';
        pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_518,".vtk");
        local_4a0._M_dataplus._M_p = (pbVar14->_M_dataplus)._M_p;
        paVar17 = &pbVar14->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p == paVar17) {
          local_4a0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_4a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        }
        else {
          local_4a0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_4a0._M_string_length = pbVar14->_M_string_length;
        (pbVar14->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar14->_M_string_length = 0;
        (pbVar14->field_2)._M_local_buf[0] = '\0';
        lf::io::VtkWriter::VtkWriter((VtkWriter *)local_448,&local_480,&local_4a0,0,'\x01');
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != paVar1) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_480.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_480.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        lf::refinement::MeshHierarchy::RefineRegular(&local_e8,rp_regular);
        lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_448);
        if ((pointer)this != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != local_4c8);
    }
    lf::refinement::MeshHierarchy::~MeshHierarchy(&local_e8);
    if ((_Head_base<0UL,_lf::mesh::MeshFactory_*,_false>)local_470._8_8_ !=
        (_Head_base<0UL,_lf::mesh::MeshFactory_*,_false>)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_470._8_8_);
    }
    local_268._vptr_StructuredMeshBuilder = (_func_int **)&PTR___cxa_pure_virtual_0033e570;
    if (local_268.mesh_factory_._M_t.
        super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
        _M_t.
        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)0x0) {
      (*(*(_func_int ***)
          local_268.mesh_factory_._M_t.
          super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
          _M_t.
          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)[7])();
    }
    if (local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar18 = 0;
  }
  else {
    poVar10 = boost::program_options::operator<<((ostream *)&std::cout,&local_228);
    local_448[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_448,1);
    iVar18 = 1;
  }
  local_188.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)&PTR__variables_map_0033f9b8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_188.m_required._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_188.m_final._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(&local_188.
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ._M_t);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_228.groups);
  if (local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_228.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_228.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_caption._M_dataplus._M_p != &local_228.m_caption.field_2) {
    operator_delete(local_228.m_caption._M_dataplus._M_p,
                    local_228.m_caption.field_2._M_allocated_capacity + 1);
  }
  return iVar18;
}

Assistant:

int main(int argc, char **argv) {
  // define allowed command line arguments:
  namespace po = boost::program_options;
  po::options_description desc("Allowed options");
  desc.add_options()("help", "Produce this help message")(
      "num_steps", po::value<size_t>()->default_value(4),
      "Number of uniform refinement steps")(
      "num_x_cells", po::value<size_type>()->default_value(4),
      "Number of cells in x direction")(
      "num_y_cells", po::value<size_type>()->default_value(4),
      "Number of cells in y direction")(
      "top_right_corner",
      po::value<std::vector<double>>()->multitoken()->default_value(
          std::vector<double>{1., 4.}, "1., 4."),
      "Coordinates of top right corner of rectangle with bottom left at (0,0)");

  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  po::notify(vm);

  if (vm.count("help") != 0U) {
    std::cout << desc << '\n';
    return 1;
  }

  const size_t num_steps = vm["num_steps"].as<size_t>();
  const size_type num_x_cells = vm["num_x_cells"].as<size_type>();
  const size_type num_y_cells = vm["num_y_cells"].as<size_type>();
  std::vector<double> top_right_corner_coords =
      vm["top_right_corner"].as<std::vector<double>>();

  std::unique_ptr<lf::mesh::hybrid2d::MeshFactory> mesh_factory_ptr =
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(3);

  // build tensor product mesh by specifying rectangle from which torus will
  // be generated by identifying opposite edges
  lf::mesh::utils::TorusMeshBuilder builder(std::move(mesh_factory_ptr));
  builder.setBottomLeftCorner(Eigen::Vector2d{0., 0.});
  builder.setTopRightCorner(Eigen::Vector2d{top_right_corner_coords.data()});
  builder.setNumXCells(num_x_cells);
  builder.setNumYCells(num_y_cells);
  const std::shared_ptr<lf::mesh::Mesh> mesh_ptr = builder.Build();

  // output mesh information
  const lf::mesh::Mesh &mesh = *mesh_ptr;
  lf::mesh::utils::PrintInfo(std::cout, mesh);
  std::cout << '\n';

  // build mesh hierarchy
  lf::refinement::MeshHierarchy multi_mesh(
      mesh_ptr, std::make_unique<lf::mesh::hybrid2d::MeshFactory>(3));

  for (int step = 0; step < num_steps; ++step) {
    // obtain pointer to mesh on finest level
    const size_type n_levels = multi_mesh.NumLevels();
    const std::shared_ptr<const lf::mesh::Mesh> mesh_fine =
        multi_mesh.getMesh(n_levels - 1);

    // print number of entities of various co-dimensions
    std::cout << "Mesh on level " << n_levels - 1 << ": "
              << mesh_fine->NumEntities(2) << " nodes, "
              << mesh_fine->NumEntities(1) << " edges, "
              << mesh_fine->NumEntities(0) << " cells," << '\n';

    lf::io::writeMatplotlib(*mesh_fine, std::string("torus_refinement") +
                                            std::to_string(step) + ".csv");

    const lf::io::VtkWriter vtk_writer(
        mesh_fine,
        std::string("torus_refinement") + std::to_string(step) + ".vtk");

    multi_mesh.RefineRegular();
  }

  return 0;
}